

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * rightJustifyZero_abi_cxx11_(string *__return_storage_ptr__,int input,int width)

{
  long lVar1;
  char cVar2;
  stringstream s;
  stringstream asStack_1a8 [16];
  long local_198 [2];
  long alStack_188 [12];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  *(long *)((long)alStack_188 + *(long *)(local_198[0] + -0x18)) = (long)width;
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)asStack_1a8 + (char)lVar1 + '\x10');
    acStack_b8[lVar1] = cVar2;
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  std::ostream::operator<<((ostream *)local_198,input);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string rightJustifyZero (const int input, const int width)
{
  std::stringstream s;
  s << std::setw (width) << std::setfill ('0') << input;
  return s.str ();
}